

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

void __thiscall CEditor::RenderLayers(CEditor *this,CUIRect ToolBox,CUIRect View)

{
  CUI *this_00;
  bool *pbVar1;
  CLayerGroup **pID;
  uint uVar2;
  long lVar3;
  CLayerGroup *pCVar4;
  CLayer *pCVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  int i;
  int g;
  ulong uVar11;
  long in_FS_OFFSET;
  float fVar12;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  CUIRect SaveCheck;
  CUIRect VisibleToggle;
  CUIRect Button;
  CUIRect Slot;
  CUIRect local_88;
  char aBuf [64];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (this->m_Map).m_lGroups.num_elements;
  uVar8 = 0;
  uVar11 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar11 = uVar8;
  }
  fVar14 = 12.0;
  for (; uVar11 != uVar8; uVar8 = uVar8 + 1) {
    fVar14 = fVar14 + 19.0;
    pCVar4 = (this->m_Map).m_lGroups.list[uVar8];
    if (pCVar4->m_Collapse == false) {
      fVar14 = fVar14 + (float)(pCVar4->m_lLayers).num_elements * 14.0;
    }
  }
  fVar15 = fVar14 - ToolBox.h;
  local_88 = ToolBox;
  if (ToolBox.h < fVar14) {
    CUIRect::VSplitRight(&local_88,15.0,&local_88,(CUIRect *)aBuf);
    CUIRect::VSplitRight(&local_88,3.0,&local_88,(CUIRect *)0x0);
    this_00 = &this->m_UI;
    RenderLayers::s_ScrollValue =
         CUI::DoScrollbarV(this_00,&RenderLayers::s_ScrollValue,(CUIRect *)aBuf,
                           RenderLayers::s_ScrollValue);
    bVar6 = CUI::MouseInside(this_00,(CUIRect *)aBuf);
    if ((bVar6) || (bVar6 = CUI::MouseInside(this_00,&local_88), bVar6)) {
      iVar10 = (int)((fVar14 - local_88.h) / 15.0);
      if (-1 < iVar10) {
        iVar7 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x1a4,0);
        fVar16 = (float)(iVar10 + 1);
        if ((char)iVar7 != '\0') {
          fVar12 = RenderLayers::s_ScrollValue - 1.0 / fVar16;
          fVar13 = 1.0;
          if (fVar12 <= 1.0) {
            fVar13 = fVar12;
          }
          RenderLayers::s_ScrollValue = (float)(~-(uint)(fVar12 < 0.0) & (uint)fVar13);
        }
        iVar10 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x1a5,0);
        if ((char)iVar10 != '\0') {
          fVar13 = 1.0 / fVar16 + RenderLayers::s_ScrollValue;
          fVar16 = 1.0;
          if (fVar13 <= 1.0) {
            fVar16 = fVar13;
          }
          RenderLayers::s_ScrollValue = (float)(~-(uint)(fVar13 < 0.0) & (uint)fVar16);
        }
      }
    }
  }
  fVar13 = fVar15 * RenderLayers::s_ScrollValue;
  fVar12 = 0.0;
  fVar16 = 0.0;
  if (0.0 <= fVar13) {
    fVar16 = fVar13;
  }
  fVar14 = fVar14 - (1.0 - RenderLayers::s_ScrollValue) * fVar15;
  uVar11 = 0;
  while( true ) {
    if (((long)(this->m_Map).m_lGroups.num_elements <= (long)uVar11) || (fVar14 < fVar12)) break;
    fVar15 = (float)((this->m_Map).m_lGroups.list[uVar11]->m_lLayers).num_elements;
    if (fVar16 <= fVar15 * 14.0 + fVar12 + 19.0) {
      if (fVar16 <= fVar12) {
        CUIRect::HSplitTop(&local_88,12.0,&Slot,&local_88);
        CUIRect::VSplitLeft(&Slot,12.0,&VisibleToggle,&Slot);
        pCVar4 = (this->m_Map).m_lGroups.list[uVar11];
        pcVar9 = "H";
        if (pCVar4->m_Visible != false) {
          pcVar9 = "V";
        }
        iVar10 = DoButton_Ex(this,&pCVar4->m_Visible,pcVar9,(uint)pCVar4->m_Collapse,&VisibleToggle,
                             0,"Toggle group visibility",5,10.0);
        if (iVar10 != 0) {
          pbVar1 = &(this->m_Map).m_lGroups.list[uVar11]->m_Visible;
          *pbVar1 = (bool)(*pbVar1 ^ 1);
        }
        CUIRect::VSplitRight(&Slot,12.0,&Slot,&SaveCheck);
        pCVar4 = (this->m_Map).m_lGroups.list[uVar11];
        iVar10 = DoButton_Ex(this,&pCVar4->m_SaveToMap,"S",(uint)pCVar4->m_SaveToMap,&SaveCheck,0,
                             "Enable/disable group for saving",10,10.0);
        pCVar4 = (this->m_Map).m_lGroups.list[uVar11];
        if ((iVar10 != 0) && (pCVar4->m_GameGroup == false)) {
          pCVar4->m_SaveToMap = (bool)(pCVar4->m_SaveToMap ^ 1);
        }
        str_format(aBuf,0x40,"#%d %s",uVar11 & 0xffffffff,pCVar4->m_aName);
        fVar13 = Slot.w * 10.0;
        (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[6])
                  (this->m_pTextRender,aBuf,0xffffffffffffffff);
        fVar13 = fVar13 / extraout_XMM0_Da;
        fVar15 = 10.0;
        if (fVar13 <= 10.0) {
          fVar15 = fVar13;
        }
        pID = (this->m_Map).m_lGroups.list + uVar11;
        pcVar9 = "Select group. Double click to collapse.";
        if ((*pID)->m_Collapse != false) {
          pcVar9 = "Select group. Double click to expand.";
        }
        iVar10 = DoButton_Ex(this,pID,aBuf,(uint)(uVar11 == (uint)this->m_SelectedGroup),&Slot,1,
                             pcVar9,0,(float)(-(uint)(fVar13 < 6.0) & 0x40c00000 |
                                             ~-(uint)(fVar13 < 6.0) & (uint)fVar15));
        if (iVar10 != 0) {
          this->m_SelectedGroup = (int)uVar11;
          this->m_SelectedLayer = 0;
          if (iVar10 == 2) {
            CUI::DoPopupMenu(&this->m_UI,(int)(this->m_UI).m_MouseX,(int)(this->m_UI).m_MouseY,0x91,
                             0xdc,this,PopupGroup,0xf);
          }
          if ((((this->m_Map).m_lGroups.list[uVar11]->m_lLayers).num_elements != 0) &&
             (iVar10 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[0xb])(),
             (char)iVar10 != '\0')) {
            pbVar1 = &(this->m_Map).m_lGroups.list[uVar11]->m_Collapse;
            *pbVar1 = (bool)(*pbVar1 ^ 1);
          }
        }
        CUIRect::HSplitTop(&local_88,2.0,&Slot,&local_88);
      }
      fVar12 = fVar12 + 14.0;
      uVar8 = 0;
      while( true ) {
        pCVar4 = (this->m_Map).m_lGroups.list[uVar11];
        if (((long)(pCVar4->m_lLayers).num_elements <= (long)uVar8) || (fVar14 < fVar12)) break;
        if (fVar16 <= fVar12) {
          if (pCVar4->m_Collapse == false) {
            CUIRect::HSplitTop(&local_88,12.0,&Slot,&local_88);
            CUIRect::VSplitLeft(&Slot,12.0,(CUIRect *)0x0,&Button);
            CUIRect::VSplitLeft(&Button,15.0,&VisibleToggle,&Button);
            pCVar5 = ((this->m_Map).m_lGroups.list[uVar11]->m_lLayers).list[uVar8];
            pcVar9 = "H";
            if (pCVar5->m_Visible != false) {
              pcVar9 = "V";
            }
            iVar10 = DoButton_Ex(this,&pCVar5->m_Visible,pcVar9,0,&VisibleToggle,0,
                                 "Toggle layer visibility",5,10.0);
            if (iVar10 != 0) {
              pbVar1 = &((this->m_Map).m_lGroups.list[uVar11]->m_lLayers).list[uVar8]->m_Visible;
              *pbVar1 = (bool)(*pbVar1 ^ 1);
            }
            CUIRect::VSplitRight(&Button,12.0,&Button,&SaveCheck);
            pCVar5 = ((this->m_Map).m_lGroups.list[uVar11]->m_lLayers).list[uVar8];
            iVar10 = DoButton_Ex(this,&pCVar5->m_SaveToMap,"S",(uint)pCVar5->m_SaveToMap,&SaveCheck,
                                 0,"Enable/disable layer for saving",10,10.0);
            pCVar5 = ((this->m_Map).m_lGroups.list[uVar11]->m_lLayers).list[uVar8];
            if ((iVar10 != 0) && (pCVar5 != (CLayer *)(this->m_Map).m_pGameLayer)) {
              pCVar5->m_SaveToMap = (bool)(pCVar5->m_SaveToMap ^ 1);
            }
            if (pCVar5->m_aName[0] == '\0') {
              if (pCVar5->m_Type == 2) {
                pcVar9 = "Tiles";
              }
              else {
                pcVar9 = "Quads";
              }
              str_copy(aBuf,pcVar9,0x40);
            }
            else {
              str_format(aBuf,0x40,"%s",pCVar5->m_aName);
            }
            fVar13 = Button.w * 10.0;
            (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[6])
                      (this->m_pTextRender,aBuf,0xffffffffffffffff);
            fVar13 = fVar13 / extraout_XMM0_Da_00;
            fVar15 = 10.0;
            if (fVar13 <= 10.0) {
              fVar15 = fVar13;
            }
            iVar10 = DoButton_Ex(this,((this->m_Map).m_lGroups.list[uVar11]->m_lLayers).list[uVar8],
                                 aBuf,(uint)((uint)this->m_SelectedLayer == uVar8 &&
                                            (uint)this->m_SelectedGroup == uVar11),&Button,1,
                                 "Select layer.",0,
                                 (float)(-(uint)(fVar13 < 6.0) & 0x40c00000 |
                                        ~-(uint)(fVar13 < 6.0) & (uint)fVar15));
            if (iVar10 != 0) {
              this->m_SelectedLayer = (int)uVar8;
              this->m_SelectedGroup = (int)uVar11;
              if (iVar10 == 2) {
                CUI::DoPopupMenu(&this->m_UI,(int)(this->m_UI).m_MouseX,(int)(this->m_UI).m_MouseY,
                                 0x78,0xf5,this,PopupLayer,0xf);
              }
            }
            fVar12 = fVar12 + 14.0;
            CUIRect::HSplitTop(&local_88,2.0,&Slot,&local_88);
          }
        }
        else {
          fVar12 = fVar12 + 14.0;
        }
        uVar8 = uVar8 + 1;
      }
      if ((fVar16 < fVar12) && (fVar12 < fVar14)) {
        CUIRect::HSplitTop(&local_88,5.0,&Slot,&local_88);
      }
      fVar12 = fVar12 + 5.0;
    }
    else {
      fVar12 = fVar12 + fVar15 * 14.0 + 19.0;
    }
    uVar11 = uVar11 + 1;
  }
  if (fVar12 <= fVar14) {
    CUIRect::HSplitTop(&local_88,12.0,&Slot,&local_88);
    iVar10 = DoButton_Editor(this,&RenderLayers::s_NewGroupButton,"Add group",0,&Slot,0,
                             "Adds a new group");
    if (iVar10 != 0) {
      CEditorMap::NewGroup(&this->m_Map);
      this->m_SelectedGroup = (this->m_Map).m_lGroups.num_elements + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditor::RenderLayers(CUIRect ToolBox, CUIRect View)
{
	CUIRect LayersBox = ToolBox;
	CUIRect Slot, Button;
	char aBuf[64];

	float LayersHeight = 12.0f;	 // Height of AddGroup button
	static float s_ScrollValue = 0;

	for(int g = 0; g < m_Map.m_lGroups.size(); g++)
	{
		// Each group is 19.0f
		// Each layer is 14.0f
		LayersHeight += 19.0f;
		if(!m_Map.m_lGroups[g]->m_Collapse)
			LayersHeight += m_Map.m_lGroups[g]->m_lLayers.size() * 14.0f;
	}

	float ScrollDifference = LayersHeight - LayersBox.h;

	if(LayersHeight > LayersBox.h)	// Do we even need a scrollbar?
	{
		CUIRect Scroll;
		LayersBox.VSplitRight(15.0f, &LayersBox, &Scroll);
		LayersBox.VSplitRight(3.0f, &LayersBox, 0);	// extra spacing
		s_ScrollValue = UI()->DoScrollbarV(&s_ScrollValue, &Scroll, s_ScrollValue);

		if(UI()->MouseInside(&Scroll) || UI()->MouseInside(&LayersBox))
		{
			int ScrollNum = (int)((LayersHeight-LayersBox.h)/15.0f)+1;
			if(ScrollNum > 0)
			{
				if(Input()->KeyPress(KEY_MOUSE_WHEEL_UP))
					s_ScrollValue = clamp(s_ScrollValue - 1.0f/ScrollNum, 0.0f, 1.0f);
				if(Input()->KeyPress(KEY_MOUSE_WHEEL_DOWN))
					s_ScrollValue = clamp(s_ScrollValue + 1.0f/ScrollNum, 0.0f, 1.0f);
			}
		}
	}

	float LayerStartAt = ScrollDifference * s_ScrollValue;
	if(LayerStartAt < 0.0f)
		LayerStartAt = 0.0f;

	float LayerStopAt = LayersHeight - ScrollDifference * (1 - s_ScrollValue);
	float LayerCur = 0;

	// render layers
	{
		for(int g = 0; g < m_Map.m_lGroups.size(); g++)
		{
			if(LayerCur > LayerStopAt)
				break;
			else if(LayerCur + m_Map.m_lGroups[g]->m_lLayers.size() * 14.0f + 19.0f < LayerStartAt)
			{
				LayerCur += m_Map.m_lGroups[g]->m_lLayers.size() * 14.0f + 19.0f;
				continue;
			}

			CUIRect VisibleToggle, SaveCheck;
			if(LayerCur >= LayerStartAt)
			{
				LayersBox.HSplitTop(12.0f, &Slot, &LayersBox);
				Slot.VSplitLeft(12, &VisibleToggle, &Slot);
				if(DoButton_Ex(&m_Map.m_lGroups[g]->m_Visible, m_Map.m_lGroups[g]->m_Visible?"V":"H", m_Map.m_lGroups[g]->m_Collapse ? 1 : 0, &VisibleToggle, 0, "Toggle group visibility", CUIRect::CORNER_L))
					m_Map.m_lGroups[g]->m_Visible = !m_Map.m_lGroups[g]->m_Visible;

				Slot.VSplitRight(12.0f, &Slot, &SaveCheck);
				if(DoButton_Ex(&m_Map.m_lGroups[g]->m_SaveToMap, "S", m_Map.m_lGroups[g]->m_SaveToMap, &SaveCheck, 0, "Enable/disable group for saving", CUIRect::CORNER_R))
					if(!m_Map.m_lGroups[g]->m_GameGroup)
						m_Map.m_lGroups[g]->m_SaveToMap = !m_Map.m_lGroups[g]->m_SaveToMap;

				str_format(aBuf, sizeof(aBuf),"#%d %s", g, m_Map.m_lGroups[g]->m_aName);
				const float FontSize = clamp(10.0f * Slot.w / TextRender()->TextWidth(10.0f, aBuf, -1), 6.0f, 10.0f);

				if(int Result = DoButton_Ex(&m_Map.m_lGroups[g], aBuf, g==m_SelectedGroup, &Slot,
					BUTTON_CONTEXT, m_Map.m_lGroups[g]->m_Collapse ? "Select group. Double click to expand." : "Select group. Double click to collapse.", 0, FontSize))
				{
					m_SelectedGroup = g;
					m_SelectedLayer = 0;

					if(Result == 2)
						UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 145, 220, this, PopupGroup);

					if(m_Map.m_lGroups[g]->m_lLayers.size() && Input()->MouseDoubleClick())
						m_Map.m_lGroups[g]->m_Collapse ^= 1;
				}
				LayersBox.HSplitTop(2.0f, &Slot, &LayersBox);
			}
			LayerCur += 14.0f;

			for(int i = 0; i < m_Map.m_lGroups[g]->m_lLayers.size(); i++)
			{
				if(LayerCur > LayerStopAt)
					break;
				else if(LayerCur < LayerStartAt)
				{
					LayerCur += 14.0f;
					continue;
				}

				if(m_Map.m_lGroups[g]->m_Collapse)
					continue;

				//visible
				LayersBox.HSplitTop(12.0f, &Slot, &LayersBox);
				Slot.VSplitLeft(12.0f, 0, &Button);
				Button.VSplitLeft(15, &VisibleToggle, &Button);

				if(DoButton_Ex(&m_Map.m_lGroups[g]->m_lLayers[i]->m_Visible, m_Map.m_lGroups[g]->m_lLayers[i]->m_Visible?"V":"H", 0, &VisibleToggle, 0, "Toggle layer visibility", CUIRect::CORNER_L))
					m_Map.m_lGroups[g]->m_lLayers[i]->m_Visible = !m_Map.m_lGroups[g]->m_lLayers[i]->m_Visible;

				Button.VSplitRight(12.0f, &Button, &SaveCheck);
				if(DoButton_Ex(&m_Map.m_lGroups[g]->m_lLayers[i]->m_SaveToMap, "S", m_Map.m_lGroups[g]->m_lLayers[i]->m_SaveToMap, &SaveCheck, 0, "Enable/disable layer for saving", CUIRect::CORNER_R))
					if(m_Map.m_lGroups[g]->m_lLayers[i] != m_Map.m_pGameLayer)
						m_Map.m_lGroups[g]->m_lLayers[i]->m_SaveToMap = !m_Map.m_lGroups[g]->m_lLayers[i]->m_SaveToMap;

				if(m_Map.m_lGroups[g]->m_lLayers[i]->m_aName[0])
					str_format(aBuf, sizeof(aBuf), "%s", m_Map.m_lGroups[g]->m_lLayers[i]->m_aName);
				else if(m_Map.m_lGroups[g]->m_lLayers[i]->m_Type == LAYERTYPE_TILES)
					str_copy(aBuf, "Tiles", sizeof(aBuf));
				else
					str_copy(aBuf, "Quads", sizeof(aBuf));

				const float FontSize = clamp(10.0f * Button.w / TextRender()->TextWidth(10.0f, aBuf, -1), 6.0f, 10.0f);

				if(int Result = DoButton_Ex(m_Map.m_lGroups[g]->m_lLayers[i], aBuf, g==m_SelectedGroup&&i==m_SelectedLayer, &Button,
					BUTTON_CONTEXT, "Select layer.", 0, FontSize))
				{
					m_SelectedLayer = i;
					m_SelectedGroup = g;
					if(Result == 2)
						UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 120, 245, this, PopupLayer);
				}

				LayerCur += 14.0f;
				LayersBox.HSplitTop(2.0f, &Slot, &LayersBox);
			}
			if(LayerCur > LayerStartAt && LayerCur < LayerStopAt)
				LayersBox.HSplitTop(5.0f, &Slot, &LayersBox);
			LayerCur += 5.0f;
		}
	}

	if(LayerCur <= LayerStopAt)
	{
		LayersBox.HSplitTop(12.0f, &Slot, &LayersBox);

		static int s_NewGroupButton = 0;
		if(DoButton_Editor(&s_NewGroupButton, "Add group", 0, &Slot, 0, "Adds a new group"))
		{
			m_Map.NewGroup();
			m_SelectedGroup = m_Map.m_lGroups.size()-1;
		}
	}
}